

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O1

Message __thiscall
testing::internal::ElementsAreMatcherImpl<const_std::array<unsigned_long,_4UL>_&>::Elements
          (ElementsAreMatcherImpl<const_std::array<unsigned_long,_4UL>_&> *this,size_t count)

{
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *in_RAX;
  char *pcVar1;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_28;
  
  local_28._M_head_impl = in_RAX;
  Message::Message((Message *)&local_28);
  std::ostream::_M_insert<unsigned_long>((ulong)(local_28._M_head_impl + 0x10));
  pcVar1 = " elements";
  if (count == 1) {
    pcVar1 = " element";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_28._M_head_impl + 0x10),pcVar1,(ulong)(count == 1) ^ 9);
  Message::Message((Message *)this,(Message *)&local_28);
  if (local_28._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_28._M_head_impl + 8))();
  }
  return (unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )(unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )this;
}

Assistant:

static Message Elements(size_t count) {
    return Message() << count << (count == 1 ? " element" : " elements");
  }